

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

char * fctstr_clone_lower(char *s)

{
  int iVar1;
  size_t sVar2;
  long local_30;
  size_t i;
  size_t klen;
  char *k;
  char *s_local;
  
  if (s == (char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    sVar2 = strlen(s);
    s_local = (char *)malloc(sVar2 + 2);
    for (local_30 = 0; local_30 != sVar2 + 1; local_30 = local_30 + 1) {
      iVar1 = tolower((int)s[local_30]);
      s_local[local_30] = (char)iVar1;
    }
  }
  return s_local;
}

Assistant:

static char*
fctstr_clone_lower(char const *s)
{
    char *k =NULL;
    size_t klen =0;
    size_t i;
    if ( s == NULL )
    {
        return NULL;
    }
    klen = strlen(s)+1;
    k = (char*)malloc(sizeof(char)*klen+1);
    for ( i=0; i != klen; ++i )
    {
        k[i] = (char)tolower(s[i]);
    }
    return k;
}